

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.hpp
# Opt level: O0

Display * lambda::operator<<(Display *display,char value)

{
  Display *in_RDI;
  string *in_stack_ffffffffffffffa8;
  Display *this;
  string local_30 [15];
  char in_stack_ffffffffffffffdf;
  
  this = in_RDI;
  show_abi_cxx11_(in_stack_ffffffffffffffdf);
  Display::operator<<(this,in_stack_ffffffffffffffa8);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

Display &operator<<(Display &display, const T value) {
    display << show(value);
    return display;
}